

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer_utils.cc
# Opt level: O0

bool draco::DirectoryExists(string *path_arg)

{
  int iVar1;
  char *__file;
  string *in_RDI;
  string path;
  stat path_stat;
  string local_c0 [32];
  stat64 local_a0;
  byte local_1;
  
  std::__cxx11::string::string(local_c0,in_RDI);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat64(__file,&local_a0);
  if (iVar1 == 0) {
    if ((local_a0.st_mode & 0x4000) == 0) {
      local_1 = 0;
    }
    else {
      local_1 = 1;
    }
  }
  else {
    local_1 = 0;
  }
  std::__cxx11::string::~string(local_c0);
  return (bool)(local_1 & 1);
}

Assistant:

bool DirectoryExists(const std::string &path_arg) {
  struct stat path_stat;
  std::string path = path_arg;

#if defined(_WIN32) && not defined(__MINGW32__)
  // Avoid a silly windows issue: stat() will fail on a drive letter missing the
  // trailing slash.
  if (path.size() > 0 && path[path.size()] != '\\' &&
      path[path.size()] != '/') {
    path.append("\\");
  }
#endif

  // Check if |path| exists.
  if (stat(path.c_str(), &path_stat) != 0) {
    return false;
  }

  // Check if |path| is a directory.
  if (path_stat.st_mode & S_IFDIR) {
    return true;
  }
  return false;
}